

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void prvTidyInsertAttributeAtEnd(Node *node,AttVal *av)

{
  AttVal *pAVar1;
  AttVal *pAVar2;
  
  pAVar1 = node->attributes;
  if (node->attributes == (AttVal *)0x0) {
    pAVar2 = (AttVal *)&node->attributes;
  }
  else {
    do {
      pAVar2 = pAVar1;
      pAVar1 = pAVar2->next;
    } while (pAVar2->next != (AttVal *)0x0);
  }
  pAVar2->next = av;
  return;
}

Assistant:

static void AddAttrToList( AttVal** list, AttVal* av )
{
  if ( *list == NULL )
    *list = av;
  else
  {
    AttVal* here = *list;
    while ( here->next )
      here = here->next;
    here->next = av;
  }
}